

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

int call_main_from_wmain
              (bool param_1,int argc,wchar_t **argv,function<int_(int,_char_**)> *realmain)

{
  pointer pbVar1;
  int iVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  ulong uVar4;
  pointer pbVar5;
  type ii;
  undefined4 in_register_00000034;
  undefined7 in_register_00000039;
  ulong uVar6;
  pointer pbVar7;
  vector<char_*,_std::allocator<char_*>_> new_argv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  utf8_argv;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined4 local_64;
  string local_60;
  wchar_t **local_40;
  ulong local_38;
  
  iVar2 = (int)CONCAT71(in_register_00000039,param_1);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = argv;
  if (iVar2 < 0) {
    QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_88,(long)iVar2);
  if (0 < iVar2) {
    local_38 = CONCAT71(in_register_00000039,param_1) & 0xffffffff;
    uVar4 = 0;
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity =
           local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (**(int **)(CONCAT44(in_register_00000034,argc) + uVar4 * 8) != 0) {
        uVar6 = 0;
        do {
          std::__cxx11::string::_M_replace_aux((ulong)&local_a8,local_a8._M_string_length,0,'\x01');
          std::__cxx11::string::_M_replace_aux((ulong)&local_a8,local_a8._M_string_length,0,'\x01');
          uVar6 = uVar6 + 1;
          sVar3 = wcslen(*(wchar_t **)(CONCAT44(in_register_00000034,argc) + uVar4 * 8));
        } while (uVar6 < sVar3);
      }
      QUtil::utf16_to_utf8(&local_60,&local_a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 &local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_38);
  }
  local_a8._M_dataplus._M_p = (pointer)0x0;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_allocated_capacity = 0;
  std::vector<char_*,_std::allocator<char_*>_>::reserve
            ((vector<char_*,_std::allocator<char_*>_> *)&local_a8,
             ((long)local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  pbVar1 = local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar5 = local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_60._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                ((vector<char*,std::allocator<char*>> *)&local_a8,(char **)&local_60);
      pbVar5 = pbVar5 + 1;
      pbVar7 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (pbVar5 != pbVar1);
  }
  uVar4 = (long)pbVar7 -
          (long)local_88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if ((uVar4 & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar4);
  }
  local_60._M_dataplus._M_p = (pointer)0x0;
  if (local_a8._M_string_length == local_a8.field_2._M_allocated_capacity) {
    std::vector<char*,std::allocator<char*>>::_M_realloc_insert<decltype(nullptr)>
              ((vector<char*,std::allocator<char*>> *)&local_a8,(iterator)local_a8._M_string_length,
               (void **)&local_60);
  }
  else {
    *(char **)local_a8._M_string_length = (char *)0x0;
    local_a8._M_string_length = local_a8._M_string_length + 8;
  }
  local_64 = (undefined4)uVar4;
  local_60._M_dataplus._M_p = local_a8._M_dataplus._M_p;
  if (local_40[2] == (wchar_t *)0x0) {
    std::__throw_bad_function_call();
  }
  iVar2 = (*(code *)local_40[3])(local_40,&local_64,&local_60);
  if (local_a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_a8._M_dataplus._M_p,
                    local_a8.field_2._M_allocated_capacity - (long)local_a8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return iVar2;
}

Assistant:

static int
call_main_from_wmain(
    bool, int argc, wchar_t const* const argv[], std::function<int(int, char*[])> realmain)
{
    // argv contains UTF-16-encoded strings with a 16-bit wchar_t. Convert this to UTF-8-encoded
    // strings for compatibility with other systems. That way the rest of qpdf.cc can just act like
    // arguments are UTF-8.

    std::vector<std::string> utf8_argv;
    utf8_argv.reserve(QIntC::to_size(argc));
    for (int i = 0; i < argc; ++i) {
        std::string utf16;
        for (size_t j = 0; j < std::wcslen(argv[i]); ++j) {
            unsigned short codepoint = static_cast<unsigned short>(argv[i][j]);
            utf16.append(1, static_cast<char>(QIntC::to_uchar(codepoint >> 8)));
            utf16.append(1, static_cast<char>(QIntC::to_uchar(codepoint & 0xff)));
        }
        utf8_argv.emplace_back(QUtil::utf16_to_utf8(utf16));
    }
    std::vector<char*> new_argv;
    new_argv.reserve(utf8_argv.size() + 1U);
    for (auto const& arg: utf8_argv) {
        new_argv.emplace_back(const_cast<char*>(arg.data()));
    }
    argc = QIntC::to_int(utf8_argv.size());
    new_argv.emplace_back(nullptr);
    return realmain(argc, new_argv.data());
}